

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  uint uVar1;
  TRef *pTVar2;
  TRef TVar3;
  uint uVar4;
  
  if (cont == lj_cont_cat) {
    uVar4 = J->maxslot;
  }
  else {
    uVar4 = (uint)*(byte *)(*(long *)((J->L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  TVar3 = lj_ir_k64(J,IR_KNUM,(uint64_t)cont);
  pTVar2 = J->base;
  pTVar2[uVar4] = TVar3;
  pTVar2[uVar4 + 1] = 0x20000;
  J->framedepth = J->framedepth + 1;
  uVar1 = J->maxslot;
  if (uVar1 < uVar4) {
    memset(pTVar2 + uVar1,0,(ulong)(~uVar1 + uVar4) * 4 + 4);
  }
  return uVar4 + 2;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = cont == lj_cont_cat ? J->maxslot : curr_proto(J->L)->framesize;
#if LJ_FR2
  J->base[top] = lj_ir_k64(J, IR_KNUM, u64ptr(contptr(cont)));
  J->base[top+1] = TREF_CONT;
#else
  J->base[top] = lj_ir_kptr(J, contptr(cont)) | TREF_CONT;
#endif
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1+LJ_FR2;
}